

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::OP_InitForInEnumerator
               (Var enumerable,ForInObjectEnumerator *enumerator,ScriptContext *scriptContext,
               EnumeratorCache *forInCache)

{
  bool bVar1;
  BOOL BVar2;
  JavascriptCopyOnAccessNativeIntArray *this;
  RecyclableObject *local_30;
  RecyclableObject *enumerableObject;
  
  if (((enumerable != (Var)0x0) &&
      (bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(enumerable), bVar1)) &&
     (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(enumerable),
     this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
  }
  BVar2 = GetPropertyObject(enumerable,scriptContext,&local_30);
  if (BVar2 == 0) {
    local_30 = (RecyclableObject *)0x0;
  }
  ForInObjectEnumerator::Initialize(enumerator,local_30,scriptContext,false,forInCache);
  return;
}

Assistant:

void JavascriptOperators::OP_InitForInEnumerator(Var enumerable, ForInObjectEnumerator * enumerator, ScriptContext* scriptContext, EnumeratorCache * forInCache)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_OP_InitForInEnumerator);
        RecyclableObject* enumerableObject;
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(enumerable);
#endif
        if (!GetPropertyObject(enumerable, scriptContext, &enumerableObject))
        {
            enumerableObject = nullptr;
        }

        enumerator->Initialize(enumerableObject, scriptContext, false, forInCache);
        JIT_HELPER_END(Op_OP_InitForInEnumerator);
    }